

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScriptLoader.cpp
# Opt level: O0

ICommand * loadCommand(Stream *stream)

{
  int iVar1;
  runtime_error *this;
  CommandType type;
  Stream *stream_local;
  
  iVar1 = (*stream->_vptr_Stream[1])();
  switch((char)iVar1) {
  case '\0':
    stream_local = (Stream *)operator_new(0x20);
    CmdLogicCompound::CmdLogicCompound((CmdLogicCompound *)stream_local,stream);
    break;
  case '\x01':
    stream_local = (Stream *)operator_new(0x20);
    CmdLogic::CmdLogic((CmdLogic *)stream_local,stream);
    break;
  case '\x02':
    stream_local = (Stream *)operator_new(0x10);
    CmdReturn::CmdReturn((CmdReturn *)stream_local,stream);
    break;
  case '\x03':
    stream_local = (Stream *)operator_new(0x28);
    CmdIf::CmdIf((CmdIf *)stream_local,stream);
    break;
  case '\x04':
    stream_local = (Stream *)operator_new(0x10);
    CmdElse::CmdElse((CmdElse *)stream_local,stream);
    break;
  case '\x05':
    stream_local = (Stream *)operator_new(0x18);
    CmdElseIf::CmdElseIf((CmdElseIf *)stream_local,stream);
    break;
  case '\x06':
    stream_local = (Stream *)operator_new(0x28);
    CmdFor::CmdFor((CmdFor *)stream_local,stream);
    break;
  case '\a':
    stream_local = (Stream *)operator_new(0x18);
    CmdWhile::CmdWhile((CmdWhile *)stream_local,stream);
    break;
  case '\b':
    stream_local = (Stream *)operator_new(0x28);
    ScriptBlock::ScriptBlock((ScriptBlock *)stream_local,stream);
    break;
  default:
    this = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error
              (this,"Not supported command type in ScriptLoader::loadCommand!");
    __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  case '\n':
    stream_local = (Stream *)operator_new(8);
    CmdEmpty::CmdEmpty((CmdEmpty *)stream_local,stream);
    break;
  case '\v':
    stream_local = (Stream *)operator_new(0x18);
    CmdAssign::CmdAssign((CmdAssign *)stream_local,stream);
    break;
  case '\r':
    stream_local = (Stream *)operator_new(0x18);
    CmdUnary::CmdUnary((CmdUnary *)stream_local,stream);
    break;
  case '\x0e':
    stream_local = (Stream *)operator_new(0x20);
    CmdMath::CmdMath((CmdMath *)stream_local,stream);
    break;
  case '\x0f':
    stream_local = (Stream *)operator_new(0x10);
    CmdNumeric::CmdNumeric((CmdNumeric *)stream_local,stream);
    break;
  case '\x12':
    stream_local = (Stream *)operator_new(0x10);
    CmdBool::CmdBool((CmdBool *)stream_local,stream);
    break;
  case '\x13':
    stream_local = (Stream *)operator_new(0x10);
    CmdVariable::CmdVariable((CmdVariable *)stream_local,stream);
    break;
  case '\x15':
    stream_local = (Stream *)operator_new(0x20);
    CmdGlobalFunction::CmdGlobalFunction((CmdGlobalFunction *)stream_local,stream);
  }
  return (ICommand *)stream_local;
}

Assistant:

ICommand* loadCommand(Stream* stream) {
	CommandType type = static_cast<CommandType>(stream->readByte());
	switch (type) {
		case CT_SCRIPT_BLOCK:
			return new ScriptBlock(stream);
		case CT_ASSIGN:
			return new CmdAssign(stream);
		case CT_BOOL:
			return new CmdBool(stream);
		case CT_ELSE:
			return new CmdElse(stream);
		case CT_ELSE_IF:
			return new CmdElseIf(stream);
		case CT_EMPTY:
			return new CmdEmpty(stream);
		case CT_FOR:
			return new CmdFor(stream);
		case CT_IF:
			return new CmdIf(stream);
		case CT_LOGIC:
			return new CmdLogic(stream);
		case CT_LOGIC_COMPOUND:
			return new CmdLogicCompound(stream);
		case CT_MATH:
			return new CmdMath(stream);
		case CT_NUMERIC:
			return new CmdNumeric(stream);
		case CT_RETURN:
			return new CmdReturn(stream);
		case CT_UNARY:
			return new CmdUnary(stream);
		case CT_VARIABLE:
			return new CmdVariable(stream);
		case CT_WHILE:
			return new CmdWhile(stream);
		case CT_GLOBAL_FUNCTION:
			return new CmdGlobalFunction(stream);
		default:
			throw std::runtime_error("Not supported command type in ScriptLoader::loadCommand!");
	}
}